

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O3

string * __thiscall
stackjit::(anonymous_namespace)::loadString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryData *data,size_t *index
          )

{
  unsigned_long uVar1;
  string *psVar2;
  pointer pcVar3;
  
  uVar1 = anon_unknown_4::loadData<unsigned_long>
                    (*(anon_unknown_4 **)this,*(BinaryData **)(this + 8),(size_t *)data);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (uVar1 != 0) {
    pcVar3 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      if ((pointer)(*(long *)(this + 8) - *(long *)this) <= pcVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      psVar2 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pcVar3 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start + 1;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = pcVar3;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return psVar2;
}

Assistant:

std::string loadString(BinaryData& data, std::size_t& index) {
			auto size = loadData<std::size_t>(data, index);
			std::string str;
			str.reserve(size);

			for (std::size_t i = 0; i < size; i++, index++) {
				str.push_back(data.at(index));
			}

			return str;
		}